

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void duckdb::AggregateExecutor::
     BinaryUpdateLoop<duckdb::ArgMinMaxState<short,duckdb::string_t>,short,duckdb::string_t,duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>>
               (short *adata,AggregateInputData *aggr_input_data,string_t *bdata,
               ArgMinMaxState<short,_duckdb::string_t> *state,idx_t count,SelectionVector *asel,
               SelectionVector *bsel,ValidityMask *avalidity,ValidityMask *bvalidity)

{
  idx_t i;
  ulong uVar1;
  AggregateBinaryInput local_58;
  
  local_58.left_mask = avalidity;
  local_58.right_mask = bvalidity;
  local_58.input = aggr_input_data;
  for (uVar1 = 0; count != uVar1; uVar1 = uVar1 + 1) {
    local_58.lidx = uVar1;
    if (asel->sel_vector != (sel_t *)0x0) {
      local_58.lidx = (idx_t)asel->sel_vector[uVar1];
    }
    local_58.ridx = uVar1;
    if (bsel->sel_vector != (sel_t *)0x0) {
      local_58.ridx = (idx_t)bsel->sel_vector[uVar1];
    }
    ArgMinMaxBase<duckdb::GreaterThan,false>::
    Operation<short,duckdb::string_t,duckdb::ArgMinMaxState<short,duckdb::string_t>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>>
              (state,adata + local_58.lidx,bdata + local_58.ridx,&local_58);
  }
  return;
}

Assistant:

static inline void BinaryUpdateLoop(const A_TYPE *__restrict adata, AggregateInputData &aggr_input_data,
	                                    const B_TYPE *__restrict bdata, STATE_TYPE *__restrict state, idx_t count,
	                                    const SelectionVector &asel, const SelectionVector &bsel,
	                                    ValidityMask &avalidity, ValidityMask &bvalidity) {
		AggregateBinaryInput input(aggr_input_data, avalidity, bvalidity);
		if (OP::IgnoreNull() && (!avalidity.AllValid() || !bvalidity.AllValid())) {
			// potential NULL values and NULL values are ignored
			for (idx_t i = 0; i < count; i++) {
				input.lidx = asel.get_index(i);
				input.ridx = bsel.get_index(i);
				if (avalidity.RowIsValid(input.lidx) && bvalidity.RowIsValid(input.ridx)) {
					OP::template Operation<A_TYPE, B_TYPE, STATE_TYPE, OP>(*state, adata[input.lidx], bdata[input.ridx],
					                                                       input);
				}
			}
		} else {
			// quick path: no NULL values or NULL values are not ignored
			for (idx_t i = 0; i < count; i++) {
				input.lidx = asel.get_index(i);
				input.ridx = bsel.get_index(i);
				OP::template Operation<A_TYPE, B_TYPE, STATE_TYPE, OP>(*state, adata[input.lidx], bdata[input.ridx],
				                                                       input);
			}
		}
	}